

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

uint32_t __thiscall Cache::getReplacementBlockId(Cache *this,uint32_t set_id)

{
  uint uVar1;
  pointer pBVar2;
  uint uVar3;
  uint32_t i;
  int iVar4;
  ulong uVar5;
  uint32_t *puVar6;
  int res;
  uint32_t uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  pointer pBVar12;
  bool bVar13;
  
  uVar8 = (this->policy).associativity;
  pBVar2 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = uVar8 * set_id;
  uVar5 = (ulong)uVar7;
  uVar3 = uVar7 + uVar8;
  pBVar12 = pBVar2 + uVar5;
  uVar11 = uVar5;
  while( true ) {
    if (uVar3 <= uVar11) {
      if (this->replace_policy == LRU) {
        puVar6 = &pBVar2[uVar5].last_reference;
        uVar8 = *puVar6;
        for (; uVar5 < uVar3; uVar5 = uVar5 + 1) {
          uVar1 = *puVar6;
          bVar13 = uVar1 < uVar8;
          if (bVar13) {
            uVar8 = uVar1;
          }
          if (bVar13) {
            uVar7 = (uint32_t)uVar5;
          }
          puVar6 = puVar6 + 0xc;
        }
      }
      else if (this->replace_policy == RANDOM) {
        uVar3 = rand();
        uVar7 = uVar7 + uVar3 % uVar8;
      }
      else {
        iVar4 = 0;
        iVar9 = 1;
        for (uVar3 = 1; uVar3 < uVar8; uVar3 = this->plru_bit[set_id][(int)uVar3] + uVar3 * 2) {
          iVar10 = this->plru_bit[set_id][(int)uVar3] * iVar9;
          iVar9 = iVar9 * 2;
          iVar4 = iVar4 + iVar10;
        }
        uVar7 = uVar7 + iVar4;
      }
      return uVar7;
    }
    if (pBVar12->valid != true) break;
    uVar11 = uVar11 + 1;
    pBVar12 = pBVar12 + 1;
  }
  return (uint32_t)uVar11;
}

Assistant:

uint32_t Cache::getReplacementBlockId(uint32_t set_id) {
    uint32_t begin = set_id * this->policy.associativity;
    uint32_t end = begin + this->policy.associativity;
    // 空的
    for (uint32_t i = begin; i < end; i++) {
        if (!this->blocks[i].valid)
            return i;
    }

    if (this->replace_policy == Cache::ReplacePolicy::LRU) {
        // LRU
        uint32_t min_reference = this->blocks[begin].last_reference;
        uint32_t return_id = begin;
        for (uint32_t i = begin; i < end; i++) {
            if (this->blocks[i].last_reference < min_reference) {
                return_id = i;
                min_reference = this->blocks[i].last_reference;
            }
        }
        return return_id;
    } else if (this->replace_policy == Cache::ReplacePolicy::RANDOM) {
        // RANDOM
        return begin + rand() % (end - begin);
    } else {
        //PLRU
        int node, res = 0, base;
        for (node = 1, base = 1; node < this->policy.associativity; base *= 2) {
            res += base * plru_bit[set_id][node];
            node = node * 2 + plru_bit[set_id][node];
        }
        return res + begin;
    }
}